

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

ParserResult *
Catch::clara::detail::convertInto<double>
          (ParserResult *__return_storage_ptr__,string *source,double *target)

{
  byte bVar1;
  ParseResultType local_200 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d8;
  stringstream local_1a8 [8];
  stringstream ss;
  ostream local_198 [376];
  double *local_20;
  double *target_local;
  string *source_local;
  
  local_20 = target;
  target_local = (double *)source;
  source_local = (string *)__return_storage_ptr__;
  ::std::__cxx11::stringstream::stringstream(local_1a8);
  ::std::operator<<(local_198,(string *)target_local);
  ::std::istream::operator>>(local_1a8,local_20);
  bVar1 = ::std::ios::fail();
  if ((bVar1 & 1) == 0) {
    local_200[0] = Matched;
    BasicResult<Catch::clara::detail::ParseResultType>::ok<Catch::clara::detail::ParseResultType>
              (__return_storage_ptr__,local_200);
  }
  else {
    ::std::operator+(&local_1f8,"Unable to convert \'",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     target_local);
    ::std::operator+(&local_1d8,&local_1f8,"\' to destination type");
    BasicResult<Catch::clara::detail::ParseResultType>::runtimeError
              (__return_storage_ptr__,&local_1d8);
    ::std::__cxx11::string::~string((string *)&local_1d8);
    ::std::__cxx11::string::~string((string *)&local_1f8);
  }
  local_200[1] = 1;
  ::std::__cxx11::stringstream::~stringstream(local_1a8);
  return __return_storage_ptr__;
}

Assistant:

inline auto convertInto( std::string const &source, T& target ) -> ParserResult {
        std::stringstream ss;
        ss << source;
        ss >> target;
        if( ss.fail() )
            return ParserResult::runtimeError( "Unable to convert '" + source + "' to destination type" );
        else
            return ParserResult::ok( ParseResultType::Matched );
    }